

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O3

void pulse_prog_cornogun(CHAR_DATA *mob)

{
  int iVar1;
  char *format;
  
  iVar1 = number_percent();
  if ((iVar1 == 1) && (mob->position == 8)) {
    iVar1 = number_range(0,10);
    if (iVar1 == 2) {
      format = "$n ceases flapping its wings incessantly to let out a mournful screech.";
    }
    else if (iVar1 == 1) {
      format = "$n pauses momentarily to spit, leaving a disgusting substance all over the floor.";
    }
    else {
      if (iVar1 != 0) {
        iVar1 = skill_lookup("faerie fog");
        spell_faerie_fog(iVar1,(int)mob->level,mob,(void *)0x0,0);
        return;
      }
      format = "$n chitters annoyingly at everyone in the room.";
    }
    act(format,mob,(void *)0x0,(void *)0x0,0);
    return;
  }
  return;
}

Assistant:

void pulse_prog_cornogun(CHAR_DATA *mob)
{
	if (number_percent() != 1 || mob->position != POS_STANDING)
		return;

	switch (number_range(0, 10))
	{
		case 0:
			act("$n chitters annoyingly at everyone in the room.", mob, 0, 0, TO_ROOM);
			break;
		case 1:
			act("$n pauses momentarily to spit, leaving a disgusting substance all over the floor.", mob, 0, 0, TO_ROOM);
			break;
		case 2:
			act("$n ceases flapping its wings incessantly to let out a mournful screech.", mob, 0, 0, TO_ROOM);
			break;
		default:
			spell_faerie_fog(skill_lookup("faerie fog"), mob->level, mob, nullptr, TAR_IGNORE);
			break;
	}
}